

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsValueRef
WScriptJsrt::BroadcastCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  RuntimeThreadLocalData *pRVar2;
  HANDLE pVVar3;
  PAL_FILE *pPVar4;
  _List_node_base *p_Var5;
  JsValueRef local_28;
  JsValueRef returnValue;
  
  local_28 = (JsValueRef)0x0;
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_28);
  if ((1 < argumentCount) && (JVar1 == JsNoError)) {
    pRVar2 = GetRuntimeThreadLocalData();
    if (pRVar2->threadData != (RuntimeThreadData *)0x0) {
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetSharedArrayBufferContent)
                (arguments[1],&pRVar2->threadData->sharedContent);
      pVVar3 = CreateSemaphoreW((LPSECURITY_ATTRIBUTES)0x0,0,
                                (LONG)(pRVar2->threadData->children).
                                      super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>
                                      ._M_impl._M_node._M_size,(LPCWSTR)0x0);
      pRVar2->threadData->hSemaphore = pVVar3;
      if (pRVar2->threadData->hSemaphore == (HANDLE)0x0) {
        pPVar4 = PAL_get_stderr(0);
        PAL_fwprintf(pPVar4,L"Couldn\'t create semaphore.\n");
        pPVar4 = PAL_get_stderr(0);
        PAL_fflush(pPVar4);
      }
      else {
        for (p_Var5 = (pRVar2->threadData->children).
                      super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>.
                      _M_impl._M_node.super__List_node_base._M_next;
            p_Var5 != (_List_node_base *)&pRVar2->threadData->children; p_Var5 = p_Var5->_M_next) {
          SetEvent((p_Var5[1]._M_next)->_M_prev);
        }
        WaitForSingleObject(pRVar2->threadData->hSemaphore,0xffffffff);
        CloseHandle(pRVar2->threadData->hSemaphore);
        pRVar2->threadData->hSemaphore = &DAT_ffffffffffffffff;
      }
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtReleaseSharedArrayBufferContentHandle)
                (pRVar2->threadData->sharedContent);
    }
  }
  return local_28;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::BroadcastCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            ChakraRTInterface::JsGetSharedArrayBufferContent(arguments[1], &threadData->sharedContent);

            LONG count = (LONG)threadData->children.size();
            threadData->hSemaphore = CreateSemaphore(NULL, 0, count, NULL);
            if (threadData->hSemaphore)
            {
                //Clang does not support "for each" yet
                for (auto i = threadData->children.begin(); i != threadData->children.end(); i++)
                {
                    auto child = *i;
                    SetEvent(child->hevntReceivedBroadcast);
                }

                WaitForSingleObject(threadData->hSemaphore, INFINITE);
                CloseHandle(threadData->hSemaphore);
                threadData->hSemaphore = INVALID_HANDLE_VALUE;
            }
            else
            {
                fwprintf(stderr, _u("Couldn't create semaphore.\n"));
                fflush(stderr);
            }

            ChakraRTInterface::JsReleaseSharedArrayBufferContentHandle(threadData->sharedContent);
        }
    }

Error:
    return returnValue;
}